

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<4>,_1,_false>::resample_2_9
          (ssg_resampler<ymfm::ymfm_output<4>,_1,_false> *this,ymfm_output<4> *output,
          uint32_t numsamples)

{
  uint32_t uVar1;
  int32_t local_2c;
  int32_t local_28;
  int32_t sum2;
  int32_t sum1;
  int32_t sum0;
  uint32_t samp;
  uint32_t numsamples_local;
  ymfm_output<4> *output_local;
  ssg_resampler<ymfm::ymfm_output<4>,_1,_false> *this_local;
  
  sum0 = numsamples;
  _samp = output;
  output_local = (ymfm_output<4> *)this;
  for (sum1 = 0; (uint)sum1 < (uint)sum0; sum1 = sum1 + 1) {
    sum2 = 0;
    local_28 = 0;
    local_2c = 0;
    uVar1 = bitfield(this->m_sampindex,0,1);
    if (uVar1 != 0) {
      add_last(this,&sum2,&local_28,&local_2c,1);
    }
    clock_and_add(this,&sum2,&local_28,&local_2c,2);
    clock_and_add(this,&sum2,&local_28,&local_2c,2);
    clock_and_add(this,&sum2,&local_28,&local_2c,2);
    clock_and_add(this,&sum2,&local_28,&local_2c,2);
    uVar1 = bitfield(this->m_sampindex,0,1);
    if (uVar1 == 0) {
      clock_and_add(this,&sum2,&local_28,&local_2c,1);
    }
    write_to_output(this,_samp,sum2,local_28,local_2c,9);
    _samp = _samp + 1;
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_2_9(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		int32_t sum0 = 0, sum1 = 0, sum2 = 0;
		if (bitfield(m_sampindex, 0) != 0)
			add_last(sum0, sum1, sum2, 1);
		clock_and_add(sum0, sum1, sum2, 2);
		clock_and_add(sum0, sum1, sum2, 2);
		clock_and_add(sum0, sum1, sum2, 2);
		clock_and_add(sum0, sum1, sum2, 2);
		if (bitfield(m_sampindex, 0) == 0)
			clock_and_add(sum0, sum1, sum2, 1);
		write_to_output(output, sum0, sum1, sum2, 9);
	}
}